

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctflt.c
# Opt level: O3

void jpeg_idct_float(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  long lVar7;
  long lVar8;
  ushort uVar9;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float afStack_128 [64];
  
  auVar5 = _DAT_00181a60;
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  uVar6 = 9;
  lVar7 = 0;
  do {
    sVar1 = *(short *)((long)coef_block + lVar7 + 0x10);
    uVar9 = *(ushort *)((long)coef_block + lVar7 + 0x20);
    if (uVar9 == 0 && sVar1 == 0) {
      if ((((*(short *)((long)coef_block + lVar7 + 0x30) != 0) ||
           (*(short *)((long)coef_block + lVar7 + 0x40) != 0)) ||
          (*(short *)((long)coef_block + lVar7 + 0x50) != 0)) ||
         ((*(short *)((long)coef_block + lVar7 + 0x60) != 0 ||
          (*(short *)((long)coef_block + lVar7 + 0x70) != 0)))) {
        uVar9 = 0;
        goto LAB_001456ef;
      }
      fVar10 = *(float *)((long)pvVar3 + lVar7 * 2) * 0.125 *
               (float)(int)*(short *)((long)coef_block + lVar7);
      *(float *)((long)afStack_128 + lVar7 * 2) = fVar10;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x20) = fVar10;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x40) = fVar10;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x60) = fVar10;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x80) = fVar10;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0xa0) = fVar10;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0xc0) = fVar10;
      lVar8 = 0xe0;
    }
    else {
LAB_001456ef:
      fVar15 = *(float *)((long)pvVar3 + lVar7 * 2) * 0.125 *
               (float)(int)*(short *)((long)coef_block + lVar7);
      fVar16 = *(float *)((long)pvVar3 + lVar7 * 2 + 0x40) * 0.125 *
               (float)(int)((long)((ulong)uVar9 << 0x30) >> 0x30);
      fVar10 = *(float *)((long)pvVar3 + lVar7 * 2 + 0x80) * 0.125 *
               (float)(int)*(short *)((long)coef_block + lVar7 + 0x40);
      fVar13 = *(float *)((long)pvVar3 + lVar7 * 2 + 0xc0) * 0.125 *
               (float)(int)((long)((ulong)*(ushort *)((long)coef_block + lVar7 + 0x60) << 0x30) >>
                           0x30);
      fVar14 = fVar15 - fVar10;
      fVar10 = fVar10 + fVar15;
      fVar15 = fVar13 + fVar16;
      fVar13 = (fVar16 - fVar13) * 1.4142135 - fVar15;
      fVar17 = fVar10 + fVar15;
      fVar10 = fVar10 - fVar15;
      fVar16 = fVar14 + fVar13;
      fVar14 = fVar14 - fVar13;
      fVar18 = *(float *)((long)pvVar3 + lVar7 * 2 + 0xa0) * 0.125 *
               (float)(int)*(short *)((long)coef_block + lVar7 + 0x50);
      fVar19 = *(float *)((long)pvVar3 + lVar7 * 2 + 0x60) * 0.125 *
               (float)(int)((long)((ulong)*(ushort *)((long)coef_block + lVar7 + 0x30) << 0x30) >>
                           0x30);
      fVar13 = *(float *)((long)pvVar3 + lVar7 * 2 + 0x20) * 0.125 * (float)(int)sVar1;
      fVar15 = *(float *)((long)pvVar3 + lVar7 * 2 + 0xe0) * 0.125 *
               (float)(int)((long)((ulong)*(ushort *)((long)coef_block + lVar7 + 0x70) << 0x30) >>
                           0x30);
      fVar20 = fVar19 + fVar18;
      fVar18 = fVar18 - fVar19;
      fVar19 = fVar13 + fVar15;
      fVar13 = fVar13 - fVar15;
      fVar22 = fVar20 + fVar19;
      fVar21 = (fVar18 + fVar13) * 1.847759;
      fVar15 = (fVar18 * -2.613126 + fVar21) - fVar22;
      fVar18 = (fVar19 - fVar20) * 1.4142135 - fVar15;
      fVar13 = (fVar13 * -1.0823922 + fVar21) - fVar18;
      *(float *)((long)afStack_128 + lVar7 * 2) = fVar17 + fVar22;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0xe0) = fVar17 - fVar22;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x20) = fVar16 + fVar15;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0xc0) = fVar16 - fVar15;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x40) = fVar14 + fVar18;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0xa0) = fVar14 - fVar18;
      *(float *)((long)afStack_128 + lVar7 * 2 + 0x60) = fVar10 + fVar13;
      fVar10 = fVar10 - fVar13;
      lVar8 = 0x80;
    }
    *(float *)((long)afStack_128 + lVar7 * 2 + lVar8) = fVar10;
    uVar6 = uVar6 - 1;
    lVar7 = lVar7 + 2;
    if (uVar6 < 2) {
      uVar4 = (ulong)output_col;
      lVar7 = 0;
      do {
        fVar17 = afStack_128[lVar7 + 2] + afStack_128[lVar7 + 6];
        fVar10 = (afStack_128[lVar7] + 128.5) - afStack_128[lVar7 + 4];
        fVar22 = afStack_128[lVar7 + 5] + afStack_128[lVar7 + 3];
        fVar15 = afStack_128[lVar7] + 128.5 + afStack_128[lVar7 + 4];
        fVar16 = afStack_128[lVar7 + 5] - afStack_128[lVar7 + 3];
        fVar14 = afStack_128[lVar7 + 1] + afStack_128[lVar7 + 7];
        fVar13 = afStack_128[lVar7 + 1] - afStack_128[lVar7 + 7];
        fVar19 = fVar15 + fVar17;
        fVar20 = fVar22 + fVar14;
        fVar23 = (fVar16 + fVar13) * 1.847759;
        fVar18 = (fVar16 * -2.613126 + fVar23) - fVar20;
        fVar16 = (afStack_128[lVar7 + 2] - afStack_128[lVar7 + 6]) * 1.4142135 - fVar17;
        fVar21 = fVar10 + fVar16;
        fVar15 = fVar15 - fVar17;
        fVar10 = fVar10 - fVar16;
        fVar14 = (fVar14 - fVar22) * 1.4142135 - fVar18;
        fVar13 = (fVar13 * -1.0823922 + fVar23) - fVar14;
        auVar11._0_4_ = (int)(fVar14 + fVar10);
        auVar11._4_4_ = (int)(fVar10 - fVar14);
        auVar11._8_4_ = (int)(fVar13 + fVar15);
        auVar11._12_4_ = (int)(fVar15 - fVar13);
        auVar11 = pshuflw(auVar11,auVar11,0xe8);
        auVar11 = pshufhw(auVar11,auVar11,0xe8);
        auVar12._0_4_ = auVar11._0_4_;
        auVar12._8_4_ = auVar11._8_4_;
        auVar12._12_4_ = auVar11._12_4_;
        auVar12._4_4_ = auVar12._8_4_;
        auVar12 = auVar12 & auVar5;
        lVar8 = *(long *)((long)output_buf + lVar7);
        *(JSAMPLE *)(lVar8 + uVar4) = pJVar2[(int)(fVar19 + fVar20) & 0x3ff];
        *(JSAMPLE *)(lVar8 + 7 + uVar4) = pJVar2[(int)(fVar19 - fVar20) & 0x3ff];
        *(JSAMPLE *)(lVar8 + 1 + uVar4) = pJVar2[(int)(fVar21 + fVar18) & 0x3ff];
        *(JSAMPLE *)(lVar8 + 6 + uVar4) = pJVar2[(int)(fVar21 - fVar18) & 0x3ff];
        *(JSAMPLE *)(lVar8 + 2 + uVar4) = pJVar2[auVar12._0_2_];
        *(JSAMPLE *)(lVar8 + 5 + uVar4) = pJVar2[auVar12._2_2_];
        *(JSAMPLE *)(lVar8 + 3 + uVar4) = pJVar2[auVar12._4_2_];
        *(JSAMPLE *)(lVar8 + 4 + uVar4) = pJVar2[auVar12._6_2_];
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x40);
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_float(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  FAST_FLOAT tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  FAST_FLOAT tmp10, tmp11, tmp12, tmp13;
  FAST_FLOAT z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  FLOAT_MULT_TYPE *quantptr;
  FAST_FLOAT *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int ctr;
  FAST_FLOAT workspace[DCTSIZE2]; /* buffers data between passes */
#define _0_125  ((FLOAT_MULT_TYPE)0.125)

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (FLOAT_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      FAST_FLOAT dcval = DEQUANTIZE(inptr[DCTSIZE * 0],
                                    quantptr[DCTSIZE * 0] * _0_125);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0] * _0_125);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2] * _0_125);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4] * _0_125);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6] * _0_125);

    tmp10 = tmp0 + tmp2;        /* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;        /* phases 5-3 */
    tmp12 = (tmp1 - tmp3) * ((FAST_FLOAT)1.414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;       /* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1] * _0_125);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3] * _0_125);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5] * _0_125);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7] * _0_125);

    z13 = tmp6 + tmp5;          /* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = (z11 - z13) * ((FAST_FLOAT)1.414213562); /* 2*c4 */

    z5 = (z10 + z12) * ((FAST_FLOAT)1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT)1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT)2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    wsptr[DCTSIZE * 0] = tmp0 + tmp7;
    wsptr[DCTSIZE * 7] = tmp0 - tmp7;
    wsptr[DCTSIZE * 1] = tmp1 + tmp6;
    wsptr[DCTSIZE * 6] = tmp1 - tmp6;
    wsptr[DCTSIZE * 2] = tmp2 + tmp5;
    wsptr[DCTSIZE * 5] = tmp2 - tmp5;
    wsptr[DCTSIZE * 3] = tmp3 + tmp4;
    wsptr[DCTSIZE * 4] = tmp3 - tmp4;

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * And testing floats for zero is relatively expensive, so we don't bother.
     */

    /* Even part */

    /* Apply signed->unsigned and prepare float->int conversion */
    z5 = wsptr[0] + ((FAST_FLOAT)CENTERJSAMPLE + (FAST_FLOAT)0.5);
    tmp10 = z5 + wsptr[4];
    tmp11 = z5 - wsptr[4];

    tmp13 = wsptr[2] + wsptr[6];
    tmp12 = (wsptr[2] - wsptr[6]) * ((FAST_FLOAT)1.414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = wsptr[5] + wsptr[3];
    z10 = wsptr[5] - wsptr[3];
    z11 = wsptr[1] + wsptr[7];
    z12 = wsptr[1] - wsptr[7];

    tmp7 = z11 + z13;
    tmp11 = (z11 - z13) * ((FAST_FLOAT)1.414213562);

    z5 = (z10 + z12) * ((FAST_FLOAT)1.847759065); /* 2*c2 */
    tmp10 = z5 - z12 * ((FAST_FLOAT)1.082392200); /* 2*(c2-c6) */
    tmp12 = z5 - z10 * ((FAST_FLOAT)2.613125930); /* 2*(c2+c6) */

    tmp6 = tmp12 - tmp7;
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 - tmp5;

    /* Final output stage: float->int conversion and range-limit */

    outptr[0] = range_limit[((int)(tmp0 + tmp7)) & RANGE_MASK];
    outptr[7] = range_limit[((int)(tmp0 - tmp7)) & RANGE_MASK];
    outptr[1] = range_limit[((int)(tmp1 + tmp6)) & RANGE_MASK];
    outptr[6] = range_limit[((int)(tmp1 - tmp6)) & RANGE_MASK];
    outptr[2] = range_limit[((int)(tmp2 + tmp5)) & RANGE_MASK];
    outptr[5] = range_limit[((int)(tmp2 - tmp5)) & RANGE_MASK];
    outptr[3] = range_limit[((int)(tmp3 + tmp4)) & RANGE_MASK];
    outptr[4] = range_limit[((int)(tmp3 - tmp4)) & RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}